

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O2

int __thiscall anon_unknown.dwarf_e668::VideoState::handler(VideoState *this)

{
  PacketQueue<14680064UL> *this_00;
  __int_type_conflict _Var1;
  tuple<AVFrame_*,_(anonymous_namespace)::AVFrameDeleter> tVar2;
  AVRational AVar3;
  AVCodecContext *codecctx;
  int iVar4;
  pointer __p;
  pointer __p_00;
  rep rVar5;
  ostream *poVar6;
  ulong uVar7;
  long lVar8;
  unique_lock<std::mutex> lock;
  
  for (lVar8 = 0x110; lVar8 != 0x290; lVar8 = lVar8 + 0x10) {
    __p_00 = (pointer)av_frame_alloc();
    lock._M_device = (mutex_type *)0x0;
    std::__uniq_ptr_impl<AVFrame,_(anonymous_namespace)::AVFrameDeleter>::reset
              ((__uniq_ptr_impl<AVFrame,_(anonymous_namespace)::AVFrameDeleter> *)
               ((long)&this->mMovie + lVar8),__p_00);
    std::unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter>::~unique_ptr
              ((unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter> *)&lock);
  }
  this_00 = &this->mPackets;
  do {
    iVar4 = PacketQueue<14680064UL>::sendTo
                      (this_00,(this->mCodecCtx)._M_t.
                               super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                               ._M_t.
                               super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                               .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl);
    if (iVar4 == -0xb) break;
  } while (iVar4 != -0x20464f45);
  std::mutex::lock(&this->mDispPtsMutex);
  rVar5 = av_gettime();
  (this->mDisplayPtsTime).__r = rVar5;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mDispPtsMutex);
  while (((this->mMovie->mQuit)._M_base._M_i & 1U) == 0) {
    _Var1 = (this->mPictQWrite).super___atomic_base<unsigned_long>._M_i;
    tVar2.super__Tuple_impl<0UL,_AVFrame_*,_(anonymous_namespace)::AVFrameDeleter>.
    super__Head_base<0UL,_AVFrame_*,_false>._M_head_impl =
         (this->mPictQ)._M_elems[_Var1].mFrame._M_t.
         super___uniq_ptr_impl<AVFrame,_(anonymous_namespace)::AVFrameDeleter>._M_t.
         super__Tuple_impl<0UL,_AVFrame_*,_(anonymous_namespace)::AVFrameDeleter>;
    while (iVar4 = avcodec_receive_frame
                             ((this->mCodecCtx)._M_t.
                              super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                              .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl,
                              tVar2.
                              super__Tuple_impl<0UL,_AVFrame_*,_(anonymous_namespace)::AVFrameDeleter>
                              .super__Head_base<0UL,_AVFrame_*,_false>._M_head_impl), iVar4 == -0xb)
    {
      PacketQueue<14680064UL>::sendTo
                (this_00,(this->mCodecCtx)._M_t.
                         super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                         .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl);
    }
    if (iVar4 == -0x20464f45) break;
    if (iVar4 == 0) {
      AVar3 = this->mStream->time_base;
      (this->mPictQ)._M_elems[_Var1].mPts.__r =
           (long)((double)*(long *)((long)tVar2.
                                          super__Tuple_impl<0UL,_AVFrame_*,_(anonymous_namespace)::AVFrameDeleter>
                                          .super__Head_base<0UL,_AVFrame_*,_false>._M_head_impl +
                                   0x198) * ((double)AVar3.num / (double)AVar3.den) * 1000000000.0);
      codecctx = (this->mCodecCtx)._M_t.
                 super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>.
                 _M_t.
                 super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>.
                 super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl;
      uVar7 = (_Var1 + 1) % 0x18;
      (this->mPictQWrite).super___atomic_base<unsigned_long>._M_i = uVar7;
      PacketQueue<14680064UL>::sendTo(this_00,codecctx);
      if (uVar7 == (this->mPictQRead).super___atomic_base<unsigned_long>._M_i) {
        std::unique_lock<std::mutex>::unique_lock(&lock,&this->mPictQMutex);
        while ((uVar7 == (this->mPictQRead).super___atomic_base<unsigned_long>._M_i &&
               (((this->mMovie->mQuit)._M_base._M_i & 1U) == 0))) {
          std::condition_variable::wait((unique_lock *)&this->mPictQCond);
        }
        std::unique_lock<std::mutex>::~unique_lock(&lock);
      }
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cerr,"Failed to receive frame: ");
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar4);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
  }
  LOCK();
  (this->mEOS)._M_base._M_i = true;
  UNLOCK();
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->mPictQMutex);
  while (((this->mFinalUpdate)._M_base._M_i & 1U) == 0) {
    std::condition_variable::wait((unique_lock *)&this->mPictQCond);
  }
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  return 0;
}

Assistant:

int VideoState::handler()
{
    std::for_each(mPictQ.begin(), mPictQ.end(),
        [](Picture &pict) -> void
        { pict.mFrame = AVFramePtr{av_frame_alloc()}; });

    /* Prefill the codec buffer. */
    do {
        const int ret{mPackets.sendTo(mCodecCtx.get())};
        if(ret == AVERROR(EAGAIN) || ret == AVErrorEOF)
            break;
    } while(1);

    {
        std::lock_guard<std::mutex> _{mDispPtsMutex};
        mDisplayPtsTime = get_avtime();
    }

    auto current_pts = nanoseconds::zero();
    while(!mMovie.mQuit.load(std::memory_order_relaxed))
    {
        size_t write_idx{mPictQWrite.load(std::memory_order_relaxed)};
        Picture *vp{&mPictQ[write_idx]};

        /* Retrieve video frame. */
        AVFrame *decoded_frame{vp->mFrame.get()};
        int ret;
        while((ret=avcodec_receive_frame(mCodecCtx.get(), decoded_frame)) == AVERROR(EAGAIN))
            mPackets.sendTo(mCodecCtx.get());
        if(ret != 0)
        {
            if(ret == AVErrorEOF) break;
            std::cerr<< "Failed to receive frame: "<<ret <<std::endl;
            continue;
        }

        /* Get the PTS for this frame. */
        if(decoded_frame->best_effort_timestamp != AVNoPtsValue)
            current_pts = duration_cast<nanoseconds>(seconds_d64{av_q2d(mStream->time_base) *
                static_cast<double>(decoded_frame->best_effort_timestamp)});
        vp->mPts = current_pts;

        /* Update the video clock to the next expected PTS. */
        auto frame_delay = av_q2d(mCodecCtx->time_base);
        frame_delay += decoded_frame->repeat_pict * (frame_delay * 0.5);
        current_pts += duration_cast<nanoseconds>(seconds_d64{frame_delay});

        /* Put the frame in the queue to be loaded into a texture and displayed
         * by the rendering thread.
         */
        write_idx = (write_idx+1)%mPictQ.size();
        mPictQWrite.store(write_idx, std::memory_order_release);

        /* Send a packet now so it's hopefully ready by the time it's needed. */
        mPackets.sendTo(mCodecCtx.get());

        if(write_idx == mPictQRead.load(std::memory_order_acquire))
        {
            /* Wait until we have space for a new pic */
            std::unique_lock<std::mutex> lock{mPictQMutex};
            while(write_idx == mPictQRead.load(std::memory_order_acquire) &&
                !mMovie.mQuit.load(std::memory_order_relaxed))
                mPictQCond.wait(lock);
        }
    }
    mEOS = true;

    std::unique_lock<std::mutex> lock{mPictQMutex};
    while(!mFinalUpdate) mPictQCond.wait(lock);

    return 0;
}